

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_char,unsigned_char>
          (Thread *this,BinopFunc<unsigned_char,_unsigned_char> *f)

{
  uchar uVar1;
  u8 i;
  long lVar2;
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar3;
  SR result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> local_48;
  uchar local_38 [16];
  uchar local_28 [16];
  
  local_28 = (uchar  [16])Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  SVar3 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  local_38[2] = SVar3.v[2];
  local_38[3] = SVar3.v[3];
  local_38[4] = SVar3.v[4];
  local_38[5] = SVar3.v[5];
  local_38[6] = SVar3.v[6];
  local_38[7] = SVar3.v[7];
  local_38[8] = SVar3.v[8];
  local_38[9] = SVar3.v[9];
  local_38[10] = SVar3.v[10];
  local_38[0xb] = SVar3.v[0xb];
  local_38[0xc] = SVar3.v[0xc];
  local_38[0xd] = SVar3.v[0xd];
  local_38[0xe] = SVar3.v[0xe];
  local_38[0xf] = SVar3.v[0xf];
  lVar2 = 0;
  do {
    uVar1 = (*f)(local_38[lVar2],local_28[lVar2]);
    local_48.v[lVar2] = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}